

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Pooling3DLayerParams::MergeFrom
          (Pooling3DLayerParams *this,Pooling3DLayerParams *from)

{
  bool bVar1;
  Pooling3DLayerParams_PoolingType3D PVar2;
  int32_t iVar3;
  Pooling3DLayerParams_Pooling3DPaddingType PVar4;
  LogMessage *other;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  Pooling3DLayerParams *local_18;
  Pooling3DLayerParams *from_local;
  Pooling3DLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6a33);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  PVar2 = _internal_type(local_18);
  if (PVar2 != Pooling3DLayerParams_PoolingType3D_MAX) {
    PVar2 = _internal_type(local_18);
    _internal_set_type(this,PVar2);
  }
  iVar3 = _internal_kerneldepth(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_kerneldepth(local_18);
    _internal_set_kerneldepth(this,iVar3);
  }
  iVar3 = _internal_kernelheight(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_kernelheight(local_18);
    _internal_set_kernelheight(this,iVar3);
  }
  iVar3 = _internal_kernelwidth(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_kernelwidth(local_18);
    _internal_set_kernelwidth(this,iVar3);
  }
  iVar3 = _internal_stridedepth(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_stridedepth(local_18);
    _internal_set_stridedepth(this,iVar3);
  }
  iVar3 = _internal_strideheight(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_strideheight(local_18);
    _internal_set_strideheight(this,iVar3);
  }
  iVar3 = _internal_stridewidth(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_stridewidth(local_18);
    _internal_set_stridewidth(this,iVar3);
  }
  iVar3 = _internal_custompaddingfront(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_custompaddingfront(local_18);
    _internal_set_custompaddingfront(this,iVar3);
  }
  iVar3 = _internal_custompaddingback(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_custompaddingback(local_18);
    _internal_set_custompaddingback(this,iVar3);
  }
  iVar3 = _internal_custompaddingtop(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_custompaddingtop(local_18);
    _internal_set_custompaddingtop(this,iVar3);
  }
  iVar3 = _internal_custompaddingbottom(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_custompaddingbottom(local_18);
    _internal_set_custompaddingbottom(this,iVar3);
  }
  iVar3 = _internal_custompaddingleft(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_custompaddingleft(local_18);
    _internal_set_custompaddingleft(this,iVar3);
  }
  iVar3 = _internal_custompaddingright(local_18);
  if (iVar3 != 0) {
    iVar3 = _internal_custompaddingright(local_18);
    _internal_set_custompaddingright(this,iVar3);
  }
  bVar1 = _internal_countexcludepadding(local_18);
  if (bVar1) {
    bVar1 = _internal_countexcludepadding(local_18);
    _internal_set_countexcludepadding(this,bVar1);
  }
  PVar4 = _internal_paddingtype(local_18);
  if (PVar4 != Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
    PVar4 = _internal_paddingtype(local_18);
    _internal_set_paddingtype(this,PVar4);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Pooling3DLayerParams::MergeFrom(const Pooling3DLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Pooling3DLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_type() != 0) {
    _internal_set_type(from._internal_type());
  }
  if (from._internal_kerneldepth() != 0) {
    _internal_set_kerneldepth(from._internal_kerneldepth());
  }
  if (from._internal_kernelheight() != 0) {
    _internal_set_kernelheight(from._internal_kernelheight());
  }
  if (from._internal_kernelwidth() != 0) {
    _internal_set_kernelwidth(from._internal_kernelwidth());
  }
  if (from._internal_stridedepth() != 0) {
    _internal_set_stridedepth(from._internal_stridedepth());
  }
  if (from._internal_strideheight() != 0) {
    _internal_set_strideheight(from._internal_strideheight());
  }
  if (from._internal_stridewidth() != 0) {
    _internal_set_stridewidth(from._internal_stridewidth());
  }
  if (from._internal_custompaddingfront() != 0) {
    _internal_set_custompaddingfront(from._internal_custompaddingfront());
  }
  if (from._internal_custompaddingback() != 0) {
    _internal_set_custompaddingback(from._internal_custompaddingback());
  }
  if (from._internal_custompaddingtop() != 0) {
    _internal_set_custompaddingtop(from._internal_custompaddingtop());
  }
  if (from._internal_custompaddingbottom() != 0) {
    _internal_set_custompaddingbottom(from._internal_custompaddingbottom());
  }
  if (from._internal_custompaddingleft() != 0) {
    _internal_set_custompaddingleft(from._internal_custompaddingleft());
  }
  if (from._internal_custompaddingright() != 0) {
    _internal_set_custompaddingright(from._internal_custompaddingright());
  }
  if (from._internal_countexcludepadding() != 0) {
    _internal_set_countexcludepadding(from._internal_countexcludepadding());
  }
  if (from._internal_paddingtype() != 0) {
    _internal_set_paddingtype(from._internal_paddingtype());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}